

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymul.hpp
# Opt level: O3

void polymul_internal::taylor_inplace_multiplier<double,_2,_6,_12,_5>::mul(double *p1,double *p2)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  
  iVar2 = binomial(7,5);
  iVar3 = binomial(6,4);
  lVar5 = 0;
  bVar1 = true;
  do {
    bVar4 = bVar1;
    lVar6 = 0;
    do {
      p1[(long)iVar2 + lVar5 + lVar6] =
           p1[lVar5 + 1] * p2[iVar3 + lVar6] + p1[(long)iVar2 + lVar5 + lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 6);
    lVar5 = 1;
    bVar1 = false;
  } while (bVar4);
  taylor_inplace_multiplier<double,_2,_6,_12,_6>::mul(p1,p2);
  return;
}

Assistant:

static void mul(numtype p1[], const numtype p2[]) {
    if (i2 <= Ndeg2) {
      // M1(Ndeg-i2)*M2(i2) -> M1(Ndeg)
      polynomial_multiplier<numtype, Nvar - 1, Ndeg - i2, i2>::mul(
          p1 + binomial(Nvar + Ndeg - 1, Ndeg - 1),
          p1 + binomial(Nvar + Ndeg - i2 - 1, Ndeg - i2 - 1),
          p2 + binomial(Nvar + i2 - 1, i2 - 1));
    }
    taylor_inplace_multiplier<numtype, Nvar, Ndeg, Ndeg2, i2 + 1> // Back to (2), or
                                                                  // to (3) when i2+1
                                                                  // == Ndeg
        ::mul(p1, p2);
  }